

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

bool __thiscall
jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,ArrayComprehension *comp)

{
  pointer pCVar1;
  int iVar2;
  AST *pAVar3;
  pointer pCVar4;
  
  pAVar3 = left_recursive_deep(comp->body);
  iVar2 = countNewlines(&pAVar3->openFodder);
  if (iVar2 < 1) {
    pCVar4 = (comp->specs).
             super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (comp->specs).
             super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pCVar4 == pCVar1) {
        iVar2 = countNewlines(&comp->closeFodder);
        return 0 < iVar2;
      }
      iVar2 = countNewlines(&pCVar4->openFodder);
      pCVar4 = pCVar4 + 1;
    } while (iVar2 < 1);
  }
  return true;
}

Assistant:

bool shouldExpand(ArrayComprehension *comp)
    {
        if (countNewlines(open_fodder(comp->body)) > 0) {
            return true;
        }
        for (auto &spec : comp->specs) {
            if (countNewlines(spec.openFodder) > 0) {
                return true;
            }
        }
        if (countNewlines(comp->closeFodder) > 0) {
            return true;
        }
        return false;
    }